

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O1

void * tommy_hashtable_remove_existing(tommy_hashtable *hashtable,tommy_hashtable_node *node)

{
  long lVar1;
  tommy_hashtable_node **pptVar2;
  tommy_hashtable_node *ptVar3;
  tommy_hashtable_node *ptVar4;
  uint uVar5;
  tommy_node_struct *ptVar6;
  tommy_hashtable_node *ptVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = hashtable->bucket_mask & node->key;
  pptVar2 = hashtable->bucket;
  ptVar3 = pptVar2[uVar5];
  ptVar4 = node->next;
  ptVar7 = ptVar4;
  if (ptVar4 == (tommy_hashtable_node *)0x0) {
    ptVar7 = ptVar3;
  }
  ptVar7->prev = node->prev;
  if (ptVar3 == node) {
    ptVar6 = (tommy_node_struct *)(pptVar2 + uVar5);
  }
  else {
    ptVar6 = node->prev;
  }
  ptVar6->next = ptVar4;
  hashtable->count = hashtable->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashtable_remove_existing(tommy_hashtable* hashtable, tommy_hashtable_node* node)
{
	tommy_count_t pos = node->key & hashtable->bucket_mask;

	tommy_list_remove_existing(&hashtable->bucket[pos], node);

	--hashtable->count;

	return node->data;
}